

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol
          (TIntermediate *this,longlong id,TString *name,TString *mangledName,TType *type,
          TConstUnionArray *constArray,TIntermTyped *constSubtree,TSourceLoc *loc)

{
  TIntermSymbol *this_00;
  
  this_00 = (TIntermSymbol *)TIntermNode::operator_new((TIntermNode *)0x138,id);
  TIntermSymbol::TIntermSymbol(this_00,id,name,this->language,type,mangledName);
  (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])(this_00,loc);
  (this_00->constArray).unionArray = constArray->unionArray;
  this_00->constSubtree = constSubtree;
  return this_00;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(long long id, const TString& name, const TString& mangledName, const TType& type, const TConstUnionArray& constArray,
                                        TIntermTyped* constSubtree, const TSourceLoc& loc)
{
    TIntermSymbol* node = new TIntermSymbol(id, name, getStage(), type, &mangledName);
    node->setLoc(loc);
    node->setConstArray(constArray);
    node->setConstSubtree(constSubtree);

    return node;
}